

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::CopyImage::InvalidTargetTest::clean(InvalidTargetTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  reference pvVar3;
  testCase *test_case;
  Functions *gl;
  InvalidTargetTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pvVar3 = std::
           vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  Utils::deleteTexture((this->super_TestCase).m_context,pvVar3->m_dst_target,this->m_dst_tex_name);
  Utils::deleteTexture((this->super_TestCase).m_context,pvVar3->m_src_target,this->m_src_tex_name);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  if (this->m_dst_buf_name != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_dst_buf_name);
    this->m_dst_buf_name = 0;
  }
  if (this->m_src_buf_name != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_src_buf_name);
    this->m_src_buf_name = 0;
  }
  return;
}

Assistant:

void InvalidTargetTest::clean()
{
	const Functions& gl		   = m_context.getRenderContext().getFunctions();
	const testCase&  test_case = m_test_cases[m_test_case_index];

	/* Clean textures and buffers. Errors ignored */
	Utils::deleteTexture(m_context, test_case.m_dst_target, m_dst_tex_name);
	Utils::deleteTexture(m_context, test_case.m_src_target, m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;

	if (0 != m_dst_buf_name)
	{
		gl.deleteBuffers(1, &m_dst_buf_name);
		m_dst_buf_name = 0;
	}

	if (0 != m_src_buf_name)
	{
		gl.deleteBuffers(1, &m_src_buf_name);
		m_src_buf_name = 0;
	}
}